

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O0

void Omega_h::classify_sides_by_exposure(Mesh *mesh,Read<signed_char> *side_is_exposed)

{
  LO size_in;
  int ent_dim;
  Write<signed_char> local_d8;
  Read<signed_char> local_c8;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  type f;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  Write<signed_char> class_dim;
  LO ns;
  Int dim;
  Read<signed_char> *side_is_exposed_local;
  Mesh *mesh_local;
  
  class_dim.shared_alloc_.direct_ptr._4_4_ = Mesh::dim(mesh);
  size_in = Mesh::nents(mesh,class_dim.shared_alloc_.direct_ptr._4_4_ + -1);
  class_dim.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  Write<signed_char>::Write((Write<signed_char> *)local_30,size_in,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  Write<signed_char>::Write((Write<signed_char> *)local_90,(Write<signed_char> *)local_30);
  f.class_dim.shared_alloc_.direct_ptr._0_4_ = class_dim.shared_alloc_.direct_ptr._4_4_;
  Read<signed_char>::Read((Read<signed_char> *)&f.dim,side_is_exposed);
  parallel_for<Omega_h::classify_sides_by_exposure(Omega_h::Mesh*,Omega_h::Read<signed_char>)::__0>
            ((LO)class_dim.shared_alloc_.direct_ptr,(type *)local_90,"classify_sides_by_exposure");
  ent_dim = class_dim.shared_alloc_.direct_ptr._4_4_ + -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"class_dim",&local_b1);
  Write<signed_char>::Write(&local_d8,(Write<signed_char> *)local_30);
  Read<signed_char>::Read(&local_c8,&local_d8);
  Mesh::add_tag<signed_char>(mesh,ent_dim,(string *)local_b0,1,&local_c8,false);
  Read<signed_char>::~Read(&local_c8);
  Write<signed_char>::~Write(&local_d8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  classify_sides_by_exposure(Omega_h::Mesh*,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_90);
  Write<signed_char>::~Write((Write<signed_char> *)local_30);
  return;
}

Assistant:

void classify_sides_by_exposure(Mesh* mesh, Read<I8> side_is_exposed) {
  auto dim = mesh->dim();
  auto ns = mesh->nents(dim - 1);
  Write<I8> class_dim(ns);
  auto f = OMEGA_H_LAMBDA(LO s) {
    class_dim[s] = static_cast<I8>(dim - side_is_exposed[s]);
  };
  parallel_for(ns, f, "classify_sides_by_exposure");
  mesh->add_tag<I8>(dim - 1, "class_dim", 1, class_dim);
}